

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::UninterpretedOption::_InternalParse
          (UninterpretedOption *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  void *pvVar1;
  bool bVar2;
  UninterpretedOption_NamePart *msg;
  uint64 uVar3;
  string *psVar4;
  char *field_name;
  UnknownFieldSet *unknown;
  char cVar5;
  ulong tag_00;
  uint uVar6;
  uint local_44;
  UninterpretedOption *pUStack_40;
  uint32 tag;
  double *local_38;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  uVar6 = 0;
  pUStack_40 = this;
  local_38 = (double *)ptr;
LAB_002d5f2b:
  do {
    bVar2 = internal::ParseContext::Done(ctx,(char **)&local_38);
    if (bVar2) goto LAB_002d6123;
    local_38 = (double *)internal::ReadTag((char *)local_38,&local_44,0);
    if (local_38 == (double *)0x0) goto LAB_002d6143;
    tag_00 = (ulong)local_44;
    cVar5 = (char)local_44;
    switch(local_44 >> 3) {
    case 2:
      if (cVar5 == '\x12') {
        local_38 = (double *)((long)local_38 + -1);
        do {
          local_38 = (double *)((long)local_38 + 1);
          msg = RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::Add(&this->name_);
          local_38 = (double *)
                     internal::ParseContext::
                     ParseMessage<google::protobuf::UninterpretedOption_NamePart>
                               (ctx,msg,(char *)local_38);
          if (local_38 == (double *)0x0) goto LAB_002d6143;
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(char *)local_38 == '\x12'));
        goto LAB_002d5f2b;
      }
      break;
    case 3:
      if (cVar5 != '\x1a') break;
      psVar4 = _internal_mutable_identifier_value_abi_cxx11_(pUStack_40);
      local_38 = (double *)internal::InlineGreedyStringParser(psVar4,(char *)local_38,ctx);
      field_name = "google.protobuf.UninterpretedOption.identifier_value";
LAB_002d60b9:
      internal::VerifyUTF8(psVar4,field_name);
      goto joined_r0x002d60c3;
    case 4:
      if (cVar5 == ' ') {
        uVar6 = uVar6 | 8;
        uVar3 = internal::ReadVarint64((char **)&local_38);
        pUStack_40->positive_int_value_ = uVar3;
        goto joined_r0x002d60c3;
      }
      break;
    case 5:
      if (cVar5 == '(') {
        uVar6 = uVar6 | 0x10;
        uVar3 = internal::ReadVarint64((char **)&local_38);
        pUStack_40->negative_int_value_ = uVar3;
        goto joined_r0x002d60c3;
      }
      break;
    case 6:
      if (cVar5 == '1') {
        uVar6 = uVar6 | 0x20;
        pUStack_40->double_value_ = *local_38;
        local_38 = local_38 + 1;
        goto LAB_002d5f2b;
      }
      break;
    case 7:
      if (cVar5 == ':') {
        psVar4 = _internal_mutable_string_value_abi_cxx11_(pUStack_40);
        local_38 = (double *)internal::InlineGreedyStringParser(psVar4,(char *)local_38,ctx);
        goto joined_r0x002d60c3;
      }
      break;
    case 8:
      if (cVar5 == 'B') {
        psVar4 = _internal_mutable_aggregate_value_abi_cxx11_(pUStack_40);
        local_38 = (double *)internal::InlineGreedyStringParser(psVar4,(char *)local_38,ctx);
        field_name = "google.protobuf.UninterpretedOption.aggregate_value";
        goto LAB_002d60b9;
      }
    }
    if ((tag_00 == 0) || ((local_44 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_44 - 1;
      goto LAB_002d6123;
    }
    pvVar1 = this_00->ptr_;
    if (((ulong)pvVar1 & 1) == 0) {
      unknown = internal::InternalMetadata::
                mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      unknown = (UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8);
    }
    local_38 = (double *)internal::UnknownFieldParse(tag_00,unknown,(char *)local_38,ctx);
joined_r0x002d60c3:
    if (local_38 == (double *)0x0) {
LAB_002d6143:
      local_38 = (double *)0x0;
LAB_002d6123:
      (pUStack_40->_has_bits_).has_bits_[0] = (pUStack_40->_has_bits_).has_bits_[0] | uVar6;
      return (char *)local_38;
    }
  } while( true );
}

Assistant:

const char* UninterpretedOption::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_name(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string identifier_value = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_identifier_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.UninterpretedOption.identifier_value");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint64 positive_int_value = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_positive_int_value(&has_bits);
          positive_int_value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int64 negative_int_value = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_negative_int_value(&has_bits);
          negative_int_value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional double double_value = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 49)) {
          _Internal::set_has_double_value(&has_bits);
          double_value_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else goto handle_unusual;
        continue;
      // optional bytes string_value = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          auto str = _internal_mutable_string_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string aggregate_value = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          auto str = _internal_mutable_aggregate_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.UninterpretedOption.aggregate_value");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}